

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  mtree *mtree;
  __mode_t p;
  uint uVar4;
  int iVar5;
  mode_t mVar6;
  char *pcVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  ulong uVar11;
  size_t sVar12;
  size_t len;
  la_int64_t lVar13;
  size_t sVar14;
  long lVar15;
  mtree_entry *pmVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  mtree_option **global_00;
  mtree_entry *pmVar20;
  byte *pbVar21;
  long lVar22;
  long lVar23;
  undefined1 *puVar24;
  mtree_entry *pmVar25;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_108;
  uint local_fc;
  mtree_entry *local_f8;
  archive_string *local_f0;
  mtree_entry *local_e8;
  int local_dc;
  archive_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar18 = (char *)0xffffffe2;
      goto LAB_00159b9b;
    }
    local_d8 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_108 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_f0 = (archive_string *)0x1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = (mtree_entry *)&mtree->entries;
      local_e8 = (mtree_entry *)0x0;
LAB_001593aa:
      pcVar7 = (char *)0x0;
      lVar22 = 0;
      do {
        pmVar25 = (mtree_entry *)local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_00159b60;
        pvVar9 = memchr(__s,10,local_c0.st_dev);
        if (pvVar9 != (void *)0x0) {
          pmVar25 = (mtree_entry *)((long)pvVar9 + (1 - (long)__s));
          local_c0.st_dev = (__dev_t)pmVar25;
        }
        if (0xffff < (long)(pcVar7 + (long)&pmVar25->next)) {
          pcVar18 = "Line too long";
          iVar5 = 0x54;
          goto LAB_00159b59;
        }
        paVar10 = archive_string_ensure
                            ((archive_string *)mtree,(size_t)(pcVar7 + (long)&pmVar25->next + 1));
        if (paVar10 == (archive_string *)0x0) {
          pcVar18 = "Can\'t allocate working buffer";
          iVar5 = 0xc;
          goto LAB_00159b59;
        }
        memcpy((mtree->line).s + (long)pcVar7,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        pcVar18 = pcVar7 + (long)(mtree_entry **)local_c0.st_dev;
        (mtree->line).s[(long)pcVar18] = '\0';
        pcVar19 = (mtree->line).s;
        pbVar21 = (byte *)(pcVar19 + lVar22);
LAB_00159445:
        bVar2 = *pbVar21;
        if (bVar2 < 0x5c) {
          if (bVar2 == 0x23) {
            if (pvVar9 == (void *)0x0) goto LAB_0015948d;
          }
          else {
            if (bVar2 == 0) goto LAB_0015948d;
            if (bVar2 == 10) {
              if (pcVar18 == (char *)0x0) break;
              if (-1 < (long)pcVar18) {
                lVar23 = -(long)pcVar7;
                pcVar18 = pcVar7 + 1;
                lVar22 = 0;
                goto LAB_001594d4;
              }
              free_options((mtree_option *)local_108);
              entry = local_d8;
              if ((int)pcVar18 != 0) goto LAB_00159b9b;
              goto LAB_00158f79;
            }
          }
LAB_0015947b:
          pbVar21 = pbVar21 + 1;
          goto LAB_00159445;
        }
        if ((bVar2 != 0x5c) || (pbVar21[1] == 0)) goto LAB_0015947b;
        if (pbVar21[1] != 10) {
          pbVar21 = pbVar21 + 1;
          goto LAB_0015947b;
        }
        (pcVar19 + -2)[(long)pcVar18] = '\0';
        pcVar19 = (mtree->line).s;
        pcVar18 = pcVar18 + -2;
LAB_0015948d:
        pcVar7 = pcVar18;
        lVar22 = (long)pbVar21 - (long)pcVar19;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
      } while (__s != (void *)0x0);
    }
LAB_001599a4:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_108);
    entry = local_d8;
  }
LAB_00158f79:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar25 = mtree->this_entry;
  if (pmVar25 != (mtree_entry *)0x0) {
    paVar10 = &mtree->current_dir;
    local_f0 = paVar10;
    do {
      pcVar18 = pmVar25->name;
      if (((*pcVar18 == '.') && (pcVar18[1] == '.')) && (pcVar18[2] == '\0')) {
        pmVar25->used = '\x01';
        sVar14 = (mtree->current_dir).length;
        if (sVar14 != 0) {
          pcVar18 = paVar10->s;
          pcVar7 = pcVar18 + sVar14;
          do {
            pcVar19 = pcVar7;
            pcVar7 = pcVar19 + -1;
            if (pcVar7 < pcVar18) break;
          } while (*pcVar7 != '/');
          pcVar19 = pcVar19 + -2;
          if (pcVar7 < pcVar18) {
            pcVar19 = pcVar7;
          }
          (mtree->current_dir).length = (size_t)(pcVar19 + (1 - (long)pcVar18));
        }
      }
      else if (pmVar25->used == '\0') {
        pmVar25->used = '\x01';
        local_108 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_fc = 0;
        uVar4 = parse_line(a,entry,mtree,pmVar25,(int *)&local_fc);
        pcVar18 = (char *)(ulong)uVar4;
        if (pmVar25->full == '\0') {
          sVar14 = (mtree->current_dir).length;
          if (sVar14 != 0) {
            archive_strcat(paVar10,"/");
          }
          archive_strcat(paVar10,pmVar25->name);
          archive_entry_copy_pathname(entry,paVar10->s);
          mVar6 = archive_entry_filetype(entry);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar14;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar25->name);
          for (pmVar20 = pmVar25->next; pmVar20 != (mtree_entry *)0x0; pmVar20 = pmVar20->next) {
            if (((pmVar20->full != '\0') && (pmVar20->used == '\0')) &&
               (iVar5 = strcmp(pmVar25->name,pmVar20->name), iVar5 == 0)) {
              pmVar20->used = '\x01';
              uVar4 = parse_line(a,entry,mtree,pmVar20,(int *)&local_fc);
              if ((int)uVar4 < (int)pcVar18) {
                pcVar18 = (char *)(ulong)uVar4;
              }
            }
          }
        }
        if (mtree->checkfs != '\0') {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar7 = archive_entry_pathname(entry);
          }
          else {
            pcVar7 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry);
          paVar10 = local_f0;
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
            iVar5 = open(pcVar7,0x80000);
            mtree->fd = iVar5;
            __archive_ensure_cloexec_flag(iVar5);
            iVar5 = mtree->fd;
            if (iVar5 == -1) {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar7);
                pcVar18 = (char *)0xffffffec;
              }
              goto LAB_00159156;
            }
          }
          else {
LAB_00159156:
            iVar5 = mtree->fd;
          }
          if (iVar5 < 0) {
            iVar5 = lstat(pcVar7,&local_c0);
            if (iVar5 != -1) goto LAB_001591b0;
LAB_001591e5:
            if ((local_fc & 0x800) == 0) goto LAB_00159aeb;
LAB_00159301:
            pmVar25 = mtree->this_entry;
            goto LAB_00159305;
          }
          iVar5 = fstat(iVar5,&local_c0);
          if (iVar5 == -1) {
            piVar8 = __errno_location();
            archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar7);
            close(mtree->fd);
            mtree->fd = -1;
            pcVar18 = (char *)0xffffffec;
            goto LAB_001591e5;
          }
LAB_001591b0:
          p = local_c0.st_mode;
          uVar4 = local_c0.st_mode & 0xf000;
          if (uVar4 == 0xa000) {
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 != 0xa000) goto LAB_0015924f;
          }
          else if ((uVar4 != 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0x8000)) {
LAB_0015924f:
            if (((~p & 0xc000) != 0) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0xc000)) {
              switch(uVar4 - 0x1000 >> 0xc) {
              case 0:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x1000) goto LAB_001599c5;
                break;
              case 1:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x2000) goto LAB_001599c5;
                break;
              case 3:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x4000) goto LAB_001599c5;
                break;
              case 5:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x6000) goto LAB_001599c5;
              }
              if (-1 < mtree->fd) {
                close(mtree->fd);
              }
              mtree->fd = -1;
              if ((local_fc & 0x800) != 0) goto LAB_00159301;
              if ((int)pcVar18 == 0) {
                pcVar18 = archive_entry_pathname(entry);
                archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                  pcVar18);
                pcVar18 = (char *)0xffffffec;
              }
              goto LAB_00159b9b;
            }
          }
LAB_001599c5:
          uVar4 = local_fc;
          if (((local_fc & 0x1001) != 1) &&
             ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
              (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
            archive_entry_set_rdev(entry,local_c0.st_rdev);
          }
          if ((uVar4 & 0xc) == 0 || (uVar4 >> 0xc & 1) != 0) {
            archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
          }
          if ((uVar4 & 0x600) == 0 || (uVar4 >> 0xc & 1) != 0) {
            archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
          }
          if ((uVar4 & 0x1010) != 0x10) {
            archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
          }
          if ((uVar4 & 0x1020) != 0x20) {
            archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
          }
          if ((uVar4 & 0x1040) != 0x40) {
            archive_entry_set_perm(entry,p);
          }
          if ((uVar4 & 0x1080) != 0x80) {
            archive_entry_set_size(entry,local_c0.st_size);
          }
          archive_entry_set_ino(entry,local_c0.st_ino);
          archive_entry_set_dev(entry,local_c0.st_dev);
          archive_entry_linkify(mtree->resolver,&local_108,&local_d0);
          entry = local_108;
        }
LAB_00159aeb:
        lVar13 = archive_entry_size(entry);
        mtree->cur_size = lVar13;
        mtree->offset = 0;
        goto LAB_00159b9b;
      }
LAB_00159305:
      pmVar25 = pmVar25->next;
      mtree->this_entry = pmVar25;
    } while (pmVar25 != (mtree_entry *)0x0);
  }
  pcVar18 = (char *)0x1;
LAB_00159b9b:
  return (int)pcVar18;
LAB_001594d4:
  uVar11 = (ulong)(byte)pcVar19[lVar22];
  if (0x2f < uVar11) goto LAB_0015967b;
  if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
    paVar10 = local_f0;
    if ((0x800002401U >> (uVar11 & 0x3f) & 1) != 0) goto LAB_00159519;
    if (uVar11 == 0x2f) {
      iVar5 = strncmp(pcVar19 + lVar22,"/set",4);
      if (iVar5 == 0) {
        if ((pcVar19[lVar22 + 4] == ' ') || (pcVar19[lVar22 + 4] == '\t')) {
          pcVar19 = pcVar19 + lVar22 + 4;
          goto LAB_0015976e;
        }
      }
      else {
        iVar5 = strncmp(pcVar19 + lVar22,"/unset",6);
        if ((iVar5 == 0) && ((pcVar19[lVar22 + 6] == ' ' || (pcVar19[lVar22 + 6] == '\t')))) {
          pcVar18 = strchr(pcVar19 + lVar22 + 6,0x3d);
          if (pcVar18 != (char *)0x0) {
            pcVar18 = "/unset shall not contain `=\'";
            iVar5 = -1;
            goto LAB_00159b59;
          }
          sVar12 = strspn(pcVar19 + lVar22 + 6," \t\r\n");
          paVar10 = local_f0;
          cVar3 = pcVar19[lVar22 + 6 + sVar12];
          if (cVar3 == '\0') goto LAB_00159519;
          pcVar19 = pcVar19 + lVar22 + sVar12 + 6;
          goto LAB_001595f7;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_f0);
      goto LAB_00159b60;
    }
    goto LAB_0015967b;
  }
  lVar22 = lVar22 + 1;
  lVar23 = lVar23 + 1;
  pcVar18 = pcVar18 + -1;
  goto LAB_001594d4;
LAB_0015976e:
  sVar12 = strspn(pcVar19," \t\r\n");
  paVar10 = local_f0;
  if (pcVar19[sVar12] == '\0') goto LAB_00159519;
  pcVar7 = pcVar19 + sVar12;
  sVar12 = strcspn(pcVar7," \t\r\n");
  pcVar19 = pcVar7 + sVar12;
  pcVar18 = strchr(pcVar7,0x3d);
  sVar14 = (long)pcVar18 - (long)pcVar7;
  if (pcVar19 < pcVar18) {
    sVar14 = sVar12;
  }
  remove_option((mtree_option **)&local_108,pcVar7,sVar14);
  uVar4 = add_option(a,(mtree_option **)&local_108,pcVar7,sVar12);
  if (uVar4 != 0) {
    pcVar18 = (char *)(ulong)uVar4;
    goto LAB_00159b91;
  }
  goto LAB_0015976e;
LAB_001595f7:
  do {
    sVar12 = strcspn(pcVar19," \t\r\n");
    sVar14 = sVar12;
    if (sVar12 == 3) {
      if (((cVar3 != 'a') || (pcVar19[1] != 'l')) || (pcVar19[2] != 'l')) {
        sVar14 = 3;
        goto LAB_0015964d;
      }
      free_options((mtree_option *)local_108);
      local_108 = (archive_entry *)0x0;
    }
    else {
LAB_0015964d:
      remove_option((mtree_option **)&local_108,pcVar19,sVar14);
    }
    pcVar19 = pcVar19 + sVar12;
    sVar12 = strspn(pcVar19," \t\r\n");
    cVar3 = pcVar19[sVar12];
    pcVar19 = pcVar19 + sVar12;
  } while (cVar3 != '\0');
LAB_00159519:
  local_f0 = (archive_string *)((long)paVar10 + 1);
  __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
  if (__s == (void *)0x0) goto LAB_001599a4;
  goto LAB_001593aa;
LAB_0015967b:
  local_f8 = (mtree_entry *)local_c0.st_dev;
  local_dc = (int)local_d0;
  pmVar25 = (mtree_entry *)malloc(0x20);
  if (pmVar25 != (mtree_entry *)0x0) {
    pmVar20 = (mtree_entry *)(pcVar19 + lVar22);
    pcVar17 = pcVar7 + (long)&local_f8->next;
    lVar15 = (long)pcVar17 - lVar22;
    *(undefined8 *)((long)&pmVar25->options + 2) = 0;
    *(undefined8 *)((long)&pmVar25->name + 2) = 0;
    pmVar25->next = (mtree_entry *)0x0;
    pmVar25->options = (mtree_option *)0x0;
    pmVar16 = local_e8;
    if (local_e8 == (mtree_entry *)0x0) {
      pmVar16 = local_c8;
    }
    pmVar16->next = pmVar25;
    if (local_dc == 0) {
      local_f8 = pmVar20;
      sVar12 = strcspn((char *)pmVar20," \t\r\n");
      pmVar20 = (mtree_entry *)(pcVar19 + lVar22 + sVar12);
      local_e8 = (mtree_entry *)(lVar15 + (long)pmVar20);
    }
    else {
      if (lVar15 < 1) {
        pcVar1 = (char *)((long)pmVar20 + lVar15);
      }
      else {
        pmVar16 = (mtree_entry *)(lVar15 + (long)pmVar20);
        pcVar1 = pcVar19 + lVar22;
        pcVar7 = pcVar7 + (long)(pcVar19 + -1);
        do {
          uVar11 = (ulong)*(byte *)((long)&local_f8->next + (long)pcVar7);
          if ((0x20 < uVar11) || ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0)) {
            local_e8 = (mtree_entry *)(pcVar7 + (lVar22 - (long)pcVar17) + (long)&local_f8->next);
            sVar12 = (long)local_f8 - lVar23;
            lVar23 = lVar23 - (long)local_f8;
            lVar22 = 1;
            goto LAB_00159947;
          }
          pcVar7 = pcVar7 + -1;
          lVar23 = lVar23 + 1;
          pcVar17 = pcVar17 + -1;
          pcVar19 = pcVar18 + -1;
          pcVar18 = pcVar18 + -1;
          pmVar16 = (mtree_entry *)&pmVar16[-1].field_0x1f;
        } while (1 < (long)(pcVar19 + (long)&local_f8->next));
      }
      local_e8 = (mtree_entry *)(pcVar1 + -1);
      sVar12 = 0;
      local_f8 = local_e8;
    }
LAB_00159825:
    pcVar18 = (char *)malloc(sVar12 + 1);
    pmVar25->name = pcVar18;
    if (pcVar18 != (char *)0x0) {
      global_00 = &pmVar25->options;
      memcpy(pcVar18,local_f8,sVar12);
      pcVar18[sVar12] = '\0';
      local_f8 = pmVar25;
      parse_escapes(pcVar18,pmVar25);
      puVar24 = (undefined1 *)&local_108;
      while (puVar24 = *(undefined1 **)puVar24, puVar24 != (undefined1 *)0x0) {
        pcVar18 = *(char **)((long)puVar24 + 8);
        sVar12 = strlen(pcVar18);
        uVar4 = add_option(a,global_00,pcVar18,sVar12);
        if (uVar4 != 0) goto LAB_00159b68;
      }
      while ((sVar12 = strspn((char *)pmVar20," \t\r\n"),
             *(char *)((long)&pmVar20->next + sVar12) != '\0' &&
             (pmVar25 = (mtree_entry *)((long)&pmVar20->next + sVar12), pmVar25 < local_e8))) {
        len = strcspn((char *)pmVar25," \t\r\n");
        pmVar20 = (mtree_entry *)((long)&pmVar25->next + len);
        pmVar16 = (mtree_entry *)strchr((char *)pmVar25,0x3d);
        sVar12 = (long)pmVar16 - (long)pmVar25;
        if (pmVar20 < pmVar16) {
          sVar12 = len;
        }
        if (pmVar16 == (mtree_entry *)0x0) {
          sVar12 = len;
        }
        remove_option(global_00,(char *)pmVar25,sVar12);
        uVar4 = add_option(a,global_00,(char *)pmVar25,len);
        if (uVar4 != 0) goto LAB_00159b68;
      }
      local_e8 = local_f8;
      paVar10 = local_f0;
      goto LAB_00159519;
    }
  }
  piVar8 = __errno_location();
  iVar5 = *piVar8;
  pcVar18 = "Can\'t allocate memory";
LAB_00159b59:
  archive_set_error(&a->archive,iVar5,pcVar18);
LAB_00159b60:
  pcVar18 = (char *)0xffffffe2;
  goto LAB_00159b91;
LAB_00159947:
  if (((byte)uVar11 < 0x21) && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0)) {
    sVar12 = lVar22 - 1;
    local_f8 = pmVar16;
    local_e8 = pmVar16;
    goto LAB_00159825;
  }
  local_f8 = local_e8;
  if (lVar23 + lVar22 == 0) goto LAB_00159825;
  uVar11 = (ulong)(byte)pmVar16[-1].field_0x1e;
  lVar22 = lVar22 + 1;
  pmVar16 = (mtree_entry *)&pmVar16[-1].field_0x1f;
  goto LAB_00159947;
LAB_00159b68:
  pcVar18 = (char *)(ulong)uVar4;
LAB_00159b91:
  free_options((mtree_option *)local_108);
  goto LAB_00159b9b;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}